

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O2

void __thiscall
SmallVector_IteratorNonConstReverse_Test::~SmallVector_IteratorNonConstReverse_Test
          (SmallVector_IteratorNonConstReverse_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (SmallVector, IteratorNonConstReverse) {
    pstore::small_vector<int, 4> buffer (std::size_t{4});
    std::iota (buffer.begin (), buffer.end (), 42);

    {
        std::vector<int> const actual (buffer.rbegin (), buffer.rend ());
        EXPECT_THAT (actual, ::testing::ElementsAre (45, 44, 43, 42));
    }
    {
        std::vector<int> const actual (buffer.rcbegin (), buffer.rcend ());
        EXPECT_THAT (actual, ::testing::ElementsAre (45, 44, 43, 42));
    }
}